

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O1

void __thiscall
upb::generator::Output::operator()
          (Output *this,string_view format,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg,uint *arg_1,
          uint *arg_2,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg_3)

{
  pointer pcVar1;
  size_type sVar2;
  Nonnull<char_*> pcVar3;
  uint *num_args;
  string_view data;
  string_view format_00;
  char *local_108;
  size_t local_100;
  char local_f8;
  undefined7 uStack_f7;
  Output *local_e8;
  char *local_e0;
  long local_d8;
  Nonnull<char_*> local_d0;
  char local_c8 [32];
  long local_a8;
  Nonnull<char_*> pcStack_a0;
  char local_98 [32];
  size_type local_78;
  pointer local_70;
  long local_68;
  Nonnull<char_*> pcStack_60;
  long local_58;
  Nonnull<char_*> local_50;
  size_type local_48;
  pointer local_40;
  
  local_e0 = format._M_str;
  pcVar1 = (arg->_M_dataplus)._M_p;
  sVar2 = arg->_M_string_length;
  num_args = arg_2;
  local_e8 = this;
  pcVar3 = absl::lts_20250127::numbers_internal::FastIntToBuffer(*arg_1,local_98);
  local_a8 = (long)pcVar3 - (long)local_98;
  pcStack_a0 = local_98;
  pcVar3 = absl::lts_20250127::numbers_internal::FastIntToBuffer(*arg_2,local_c8);
  local_d8 = (long)pcVar3 - (long)local_c8;
  local_40 = (arg_3->_M_dataplus)._M_p;
  local_48 = arg_3->_M_string_length;
  local_100 = 0;
  local_f8 = '\0';
  local_68 = local_a8;
  pcStack_60 = pcStack_a0;
  format_00._M_str = (char *)&local_78;
  format_00._M_len = (size_t)local_e0;
  local_108 = &local_f8;
  local_d0 = local_c8;
  local_78 = sVar2;
  local_70 = pcVar1;
  local_58 = local_d8;
  local_50 = local_c8;
  absl::lts_20250127::substitute_internal::SubstituteAndAppendArray
            ((substitute_internal *)&local_108,(Nonnull<std::string_*>)format._M_len,format_00,
             (Nullable<const_absl::string_view_*>)0x4,(size_t)num_args);
  data._M_str = local_108;
  data._M_len = local_100;
  Write(local_e8,data);
  if (local_108 != &local_f8) {
    operator_delete(local_108,CONCAT71(uStack_f7,local_f8) + 1);
  }
  return;
}

Assistant:

void operator()(absl::string_view format, const Arg&... arg) {
    Write(absl::Substitute(format, arg...));
  }